

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O3

void Shell::Shuffling::shuffleList<unsigned_int>(List<unsigned_int> **list)

{
  List<unsigned_int> *pLVar1;
  List<unsigned_int> *pLVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  List<unsigned_int> **res;
  DArray<Lib::List<unsigned_int>_*> aux;
  DArray<Lib::List<unsigned_int>_*> local_48;
  
  pLVar1 = *list;
  if (pLVar1 != (List<unsigned_int> *)0x0) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + 1;
      pLVar1 = pLVar1->_tail;
    } while (pLVar1 != (List<unsigned_int> *)0x0);
    if (1 < uVar3) {
      uVar5 = (ulong)uVar3;
      uVar4 = uVar5 * 8 + 0xf & 0xffffffff0;
      local_48._size = uVar5;
      local_48._capacity = uVar5;
      if (uVar4 == 0) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      }
      else if (uVar4 < 0x11) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      }
      else if (uVar4 < 0x19) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      }
      else if (uVar4 < 0x21) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      }
      else if (uVar4 < 0x31) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      }
      else if (uVar4 < 0x41) {
        local_48._array =
             (List<unsigned_int> **)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      }
      else {
        local_48._array = (List<unsigned_int> **)::operator_new(uVar4,0x10);
      }
      memset(local_48._array,0,uVar5 * 8);
      uVar4 = 0;
      for (pLVar1 = *list; pLVar1 != (List<unsigned_int> *)0x0; pLVar1 = pLVar1->_tail) {
        local_48._array[uVar4] = pLVar1;
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      shuffleArray<Lib::DArray<Lib::List<unsigned_int>*>>(&local_48,uVar3);
      lVar6 = 0;
      pLVar1 = (List<unsigned_int> *)0x0;
      do {
        uVar3 = local_48._array[lVar6]->_head;
        pLVar2 = (List<unsigned_int> *)
                 Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
        ;
        pLVar2->_head = uVar3;
        pLVar2->_tail = pLVar1;
        lVar6 = lVar6 + 1;
        pLVar1 = pLVar2;
      } while (uVar5 + (uVar5 == 0) != lVar6);
      *list = pLVar2;
      if (local_48._array != (List<unsigned_int> **)0x0) {
        uVar4 = local_48._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar4 == 0) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_48._array;
        }
        else if (uVar4 < 0x11) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_48._array;
        }
        else if (uVar4 < 0x19) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_48._array;
        }
        else if (uVar4 < 0x21) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_48._array;
        }
        else if (uVar4 < 0x31) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_48._array;
        }
        else if (uVar4 < 0x41) {
          *local_48._array = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_48._array;
        }
        else {
          operator_delete(local_48._array,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

static void shuffleList(List<T>*& list) {
    unsigned len = List<T>::length(list);

    if (len <= 1) {
      return;
    }

    DArray<List<T>*> aux(len);
    unsigned idx = 0;

    List<T>* els = list;
    while (els != nullptr) {
      aux[idx++] = els;
      els = els->tail();
    }
    shuffleArray(aux,len);

    // create the new list
    List<T>* res = nullptr;
    for(idx = 0; idx < len; idx++) {
      res = List<T>::cons(aux[idx]->head(),res);
    }

    // List<T>::destroy(list);
    list = res;
  }